

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

size_t __thiscall
RVO::RVOSimulator::addAgent
          (RVOSimulator *this,Vector2 *position,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  Agent *this_00;
  size_type sVar1;
  Agent *local_48;
  Agent *agent;
  Vector2 *velocity_local;
  float maxSpeed_local;
  float radius_local;
  float timeHorizonObst_local;
  float timeHorizon_local;
  size_t maxNeighbors_local;
  Vector2 *pVStack_18;
  float neighborDist_local;
  Vector2 *position_local;
  RVOSimulator *this_local;
  
  agent = (Agent *)velocity;
  velocity_local._0_4_ = maxSpeed;
  velocity_local._4_4_ = radius;
  maxSpeed_local = timeHorizonObst;
  radius_local = timeHorizon;
  _timeHorizonObst_local = maxNeighbors;
  maxNeighbors_local._4_4_ = neighborDist;
  pVStack_18 = position;
  position_local = (Vector2 *)this;
  this_00 = (Agent *)operator_new(0x98);
  Agent::Agent(this_00,this);
  this_00->position_ = *pVStack_18;
  this_00->maxNeighbors_ = _timeHorizonObst_local;
  this_00->maxSpeed_ = velocity_local._0_4_;
  this_00->neighborDist_ = maxNeighbors_local._4_4_;
  this_00->radius_ = velocity_local._4_4_;
  this_00->timeHorizon_ = radius_local;
  this_00->timeHorizonObst_ = maxSpeed_local;
  this_00->velocity_ =
       (Vector2)(agent->agentNeighbors_).
                super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48 = this_00;
  sVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
  local_48->id_ = sVar1;
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back(&this->agents_,&local_48);
  sVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
  return sVar1 - 1;
}

Assistant:

size_t RVOSimulator::addAgent(const Vector2 &position, float neighborDist, size_t maxNeighbors, float timeHorizon, float timeHorizonObst, float radius, float maxSpeed, const Vector2 &velocity)
	{
		Agent *agent = new Agent(this);

		agent->position_ = position;
		agent->maxNeighbors_ = maxNeighbors;
		agent->maxSpeed_ = maxSpeed;
		agent->neighborDist_ = neighborDist;
		agent->radius_ = radius;
		agent->timeHorizon_ = timeHorizon;
		agent->timeHorizonObst_ = timeHorizonObst;
		agent->velocity_ = velocity;

		agent->id_ = agents_.size();

		agents_.push_back(agent);

		return agents_.size() - 1;
	}